

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const.c
# Opt level: O2

char segment_symbol(size_t i)

{
  int iVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  if (i == 0) {
    return '@';
  }
  iVar6 = g.snake.seg[i].x;
  if ((long)g.snake.len - 1U == i) {
    cVar4 = '?';
    if (iVar6 == g.snake.seg[i - 1].x) {
      cVar4 = -0x46;
    }
    if (g.snake.seg[i].y == g.snake.seg[i - 1].y) {
      return -0x33;
    }
    return cVar4;
  }
  iVar1 = g.snake.seg[i].y;
  iVar7 = iVar1 - g.snake.seg[i - 1].y;
  iVar2 = g.snake.seg[i + 1].x;
  iVar5 = iVar2 - iVar6;
  if (iVar7 == -1 || 1 < iVar7) {
    if (iVar2 == iVar6) {
      return -0x46;
    }
    if (1 < iVar5 || iVar5 == -1) {
      return -0x45;
    }
  }
  else {
    if (iVar7 == 1 || iVar7 < -1) {
      if (iVar2 == iVar6) {
        return -0x46;
      }
      if (1 < iVar5 || iVar5 == -1) {
        return -0x44;
      }
      bVar9 = SBORROW4(iVar5,-1);
      bVar8 = iVar5 + 1 < 0;
      cVar4 = -0x38;
      goto LAB_0010e1e6;
    }
    iVar6 = iVar6 - g.snake.seg[i - 1].x;
    iVar2 = g.snake.seg[i + 1].y;
    iVar5 = iVar2 - iVar1;
    if (iVar6 != -1 && iVar6 < 2) {
      cVar4 = '?';
      if (((iVar6 != 1 && -2 < iVar6) || (cVar4 = -0x33, iVar2 == iVar1)) ||
         (cVar4 = -0x44, 1 < iVar5 || iVar5 == -1)) {
        return cVar4;
      }
      bVar9 = SBORROW4(iVar5,-1);
      bVar8 = iVar5 + 1 < 0;
      cVar4 = -0x45;
      goto LAB_0010e1e6;
    }
    if (iVar2 == iVar1) {
      return -0x33;
    }
    if (1 < iVar5 || iVar5 == -1) {
      return -0x38;
    }
  }
  bVar9 = SBORROW4(iVar5,-1);
  bVar8 = iVar5 + 1 < 0;
  cVar4 = -0x37;
LAB_0010e1e6:
  cVar3 = '?';
  if (bVar9 != bVar8) {
    cVar3 = cVar4;
  }
  if (iVar5 == 1) {
    cVar3 = cVar4;
  }
  return cVar3;
}

Assistant:

char segment_symbol(size_t i) {
    char symbol = '?';
    if (i == 0) { /* Head */
        symbol = seg_head;
    } else if (i == g.snake.len-1) { /* Last segment of the tail */
        if (g.snake.seg[i].x - g.snake.seg[i-1].x == 0) symbol = seg_v;
        if (g.snake.seg[i].y - g.snake.seg[i-1].y == 0) symbol = seg_h;
    } else {
        vec2i AB = { g.snake.seg[i].x - g.snake.seg[i-1].x, g.snake.seg[i].y - g.snake.seg[i-1].y };
        vec2i BC = { g.snake.seg[i+1].x - g.snake.seg[i].x, g.snake.seg[i+1].y - g.snake.seg[i].y };
        /* Moving away from head: segment A(i-1) to segment C(i+1) through B(i).
         * The second condition of each if branch is used to ensure proper transitions
         * to the opposite part of the screen (for example on EASY level). */
        if (AB.y == -1 || AB.y > 1) { /* up */
            if (BC.x == 0) /* up */
                symbol = seg_v; /* vertical */
            else if (BC.x == -1 || BC.x >  1)
                symbol = seg_ul; /* up and left */
            else if (BC.x ==  1 || BC.x < -1)
                symbol = seg_ur; /* up and right */
        } else if (AB.y == 1 || AB.y < -1) { /* down */
            if (BC.x == 0) /* down */
                symbol = seg_v; /* vertical */
            else if (BC.x == -1 || BC.x >  1)
                symbol = seg_dl; /* down and left */
            else if (BC.x ==  1 || BC.x < -1)
                symbol = seg_dr; /* down and right */
        } else if (AB.x == -1 || AB.x > 1) { /* left */
            if (BC.y == 0) /* left */
                symbol = seg_h; /* horizontal */
            else if (BC.y == -1 || BC.y >  1)
                symbol = seg_lu; /* left and up */
            else if (BC.y ==  1 || BC.y < -1)
                symbol = seg_ld; /* left and down */
        } else if (AB.x == 1 || AB.x < -1) { /* right */
            if (BC.y == 0) /* right */
                symbol = seg_h; /* horizontal */
            else if (BC.y == -1 || BC.y >  1)
                symbol = seg_ru; /* right and up */
            else if (BC.y ==  1 || BC.y < -1)
                symbol = seg_rd; /* right and down */
        }
    }

    return symbol;
}